

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleString.cpp
# Opt level: O0

SimpleString * __thiscall
SimpleStringCollection::operator[](SimpleStringCollection *this,size_t index)

{
  ulong in_RSI;
  SimpleString *in_RDI;
  SimpleString *other;
  SimpleString local_28 [2];
  SimpleString *local_8;
  
  if (in_RSI < in_RDI[1].bufferSize_) {
    local_8 = (SimpleString *)(in_RDI->buffer_ + in_RSI * 0x10);
  }
  else {
    other = local_28;
    SimpleString::SimpleString(in_RDI,(char *)other);
    SimpleString::operator=(in_RDI,other);
    SimpleString::~SimpleString((SimpleString *)0x1114e6);
    local_8 = (SimpleString *)&in_RDI->bufferSize_;
  }
  return local_8;
}

Assistant:

SimpleString& SimpleStringCollection::operator[](size_t index)
{
    if (index >= size_) {
        empty_ = "";
        return empty_;
    }

    return collection_[index];
}